

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O0

void __thiscall OpenMD::GCNSeq::writeSequence(GCNSeq *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  undefined8 uVar10;
  SequentialAnalyzer *in_RDI;
  uint n;
  uint i;
  RealType binValue;
  Revision r;
  ofstream ofs;
  Revision *in_stack_fffffffffffffce8;
  Revision *in_stack_fffffffffffffd38;
  uint local_268;
  uint local_264;
  string local_260 [32];
  string local_240 [32];
  double local_220;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar10 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"GCN::writeSequence Error: failed to open %s\n",uVar10);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_220 = 0.0;
    poVar3 = std::operator<<(local_208,"# ");
    psVar4 = SequentialAnalyzer::getSequenceType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffd38);
    poVar3 = std::operator<<(poVar3,local_240);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_240);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffce8);
    poVar3 = std::operator<<(poVar3,local_260);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_260);
    poVar3 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&in_RDI->selectionScript1_);
    poVar3 = std::operator<<(local_208,"\"\tselection script2: \"");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI->selectionScript2_);
    std::operator<<(poVar3,"\"\n");
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(local_208,"#time\tvalue\n");
    for (local_264 = 0; sVar6 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->times_),
        local_264 < sVar6; local_264 = local_264 + 1) {
      poVar3 = std::operator<<(local_208,"#Frame ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_264);
      std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(local_208,"#Selection 1 Count: ");
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[1].dumpFilename_.field_2,
                          (ulong)local_264);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar7);
      std::operator<<(poVar3,"\n");
      local_268 = 0;
      while( true ) {
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&in_RDI[1].seleMan1_.ss_,(ulong)local_264);
        sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar8);
        if (sVar6 <= local_268) break;
        local_220 = (double)local_268 * *(double *)&in_RDI[1].dumpFilename_;
        poVar3 = (ostream *)std::ostream::operator<<(local_208,local_220);
        poVar3 = std::operator<<(poVar3,"\t");
        pvVar8 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&in_RDI[1].seleMan1_.ss_,(ulong)local_264);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(ulong)local_268);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar9);
        std::operator<<(poVar3,"\n");
        local_268 = local_268 + 1;
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void GCNSeq::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;
      RealType binValue(0.0);

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\tvalue\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << "#Frame " << i << "\n";
        ofs << "#Selection 1 Count: " << count_[i] << "\n";

        for (unsigned int n = 0; n < histogram_[i].size(); n++) {
          binValue = n * delta_;
          ofs << binValue << "\t" << histogram_[i][n] << "\n";
        }
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GCN::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }